

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

value_type *
winmd::reader::ElemSig::read_element
          (value_type *__return_storage_ptr__,database *db,ParamSig *param,byte_view *data)

{
  bool bVar1;
  TypeDefOrRef TVar2;
  TypeSig *this;
  byte_view *data_00;
  TypeRef TVar3;
  TypeDef TVar4;
  bool local_252;
  bool local_251;
  allocator<char> local_239;
  string local_238;
  _Variadic_union<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
  local_218;
  EnumValue local_208;
  EnumDefinition local_1d8;
  EnumDefinition *local_1c0;
  EnumDefinition *enum_def;
  allocator<char> local_1a1;
  string local_1a0;
  table_base *local_180;
  uint32_t local_178;
  TypeDef local_170;
  TypeDef *local_160;
  TypeDef *enum_type;
  anon_class_16_2_5432fe68 resolve_type;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_138;
  table_base *local_128;
  uint32_t local_120;
  TypeDef local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f8;
  table_base *local_e8;
  uint32_t local_e0;
  TypeDef local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  table_base *local_a8;
  uint32_t local_a0;
  TypeRef local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_78;
  table_base *local_68;
  uint32_t local_60;
  TypeRef local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [8];
  add_pointer_t<const_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>_> type_index;
  add_pointer_t<const_winmd::reader::ElementType> element_type;
  value_type *type;
  byte_view *data_local;
  ParamSig *param_local;
  database *db_local;
  
  type = (value_type *)data;
  data_local = (byte_view *)param;
  param_local = (ParamSig *)db;
  this = ParamSig::Type(param);
  element_type = (add_pointer_t<const_winmd::reader::ElementType>)TypeSig::Type(this);
  type_index = (add_pointer_t<const_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>_>)
               std::
               get_if<winmd::reader::ElementType,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                         ((variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           *)element_type);
  if (type_index !=
      (add_pointer_t<const_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>_>)0x0) {
    read_primitive(__return_storage_ptr__,
                   *(ElementType *)
                    &(type_index->super_typed_index<winmd::reader::TypeDefOrRef>).
                     super_index_base<winmd::reader::TypeDefOrRef>.m_table,(byte_view *)type);
    return __return_storage_ptr__;
  }
  local_38 = (undefined1  [8])
             std::
             get_if<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                       ((variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                         *)element_type);
  if (local_38 == (undefined1  [8])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "Custom attribute params must be primitives, enums, or System.Type",&local_239);
    impl::throw_invalid(&local_238);
  }
  TVar2 = index_base<winmd::reader::TypeDefOrRef>::type
                    ((index_base<winmd::reader::TypeDefOrRef> *)local_38);
  if (TVar2 == TypeRef) {
    TVar3 = typed_index<winmd::reader::TypeDefOrRef>::TypeRef
                      ((typed_index<winmd::reader::TypeDefOrRef> *)local_38);
    local_68 = TVar3.super_row_base<winmd::reader::TypeRef>.m_table;
    local_60 = TVar3.super_row_base<winmd::reader::TypeRef>.m_index;
    local_58.super_row_base<winmd::reader::TypeRef>.m_table = local_68;
    local_58.super_row_base<winmd::reader::TypeRef>.m_index = local_60;
    local_48 = TypeRef::TypeNamespace(&local_58);
    cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,"System");
    bVar1 = std::operator==(local_48,local_78);
    if (bVar1) {
      TVar3 = typed_index<winmd::reader::TypeDefOrRef>::TypeRef
                        ((typed_index<winmd::reader::TypeDefOrRef> *)local_38);
      local_a8 = TVar3.super_row_base<winmd::reader::TypeRef>.m_table;
      local_a0 = TVar3.super_row_base<winmd::reader::TypeRef>.m_index;
      local_98.super_row_base<winmd::reader::TypeRef>.m_table = local_a8;
      local_98.super_row_base<winmd::reader::TypeRef>.m_index = local_a0;
      local_88 = TypeRef::TypeName(&local_98);
      cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,"Type");
      bVar1 = std::operator==(local_88,local_b8);
      local_251 = true;
      if (bVar1) goto LAB_001880f6;
    }
  }
  TVar2 = index_base<winmd::reader::TypeDefOrRef>::type
                    ((index_base<winmd::reader::TypeDefOrRef> *)local_38);
  local_252 = false;
  if (TVar2 == TypeDef) {
    TVar4 = typed_index<winmd::reader::TypeDefOrRef>::TypeDef
                      ((typed_index<winmd::reader::TypeDefOrRef> *)local_38);
    local_e8 = TVar4.super_row_base<winmd::reader::TypeDef>.m_table;
    local_e0 = TVar4.super_row_base<winmd::reader::TypeDef>.m_index;
    local_d8.super_row_base<winmd::reader::TypeDef>.m_table = local_e8;
    local_d8.super_row_base<winmd::reader::TypeDef>.m_index = local_e0;
    local_c8 = TypeDef::TypeNamespace(&local_d8);
    cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_f8,"System");
    bVar1 = std::operator==(local_c8,local_f8);
    local_252 = false;
    if (bVar1) {
      TVar4 = typed_index<winmd::reader::TypeDefOrRef>::TypeDef
                        ((typed_index<winmd::reader::TypeDefOrRef> *)local_38);
      local_128 = TVar4.super_row_base<winmd::reader::TypeDef>.m_table;
      local_120 = TVar4.super_row_base<winmd::reader::TypeDef>.m_index;
      local_118.super_row_base<winmd::reader::TypeDef>.m_table = local_128;
      local_118.super_row_base<winmd::reader::TypeDef>.m_index = local_120;
      local_108 = TypeDef::TypeName(&local_118);
      cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138,"Type");
      local_252 = std::operator==(local_108,local_138);
    }
  }
  local_251 = local_252;
LAB_001880f6:
  if (local_251 == false) {
    enum_type = (TypeDef *)param_local;
    resolve_type.db = (database *)local_38;
    TVar4 = read_element::anon_class_16_2_5432fe68::operator()
                      ((anon_class_16_2_5432fe68 *)&enum_type);
    local_180 = TVar4.super_row_base<winmd::reader::TypeDef>.m_table;
    local_178 = TVar4.super_row_base<winmd::reader::TypeDef>.m_index;
    local_160 = &local_170;
    local_170.super_row_base<winmd::reader::TypeDef>.m_table = local_180;
    local_170.super_row_base<winmd::reader::TypeDef>.m_index = local_178;
    bVar1 = TypeDef::is_enum(local_160);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "CustomAttribute params that are TypeDefOrRef must be an enum or System.Type",
                 &local_1a1);
      impl::throw_invalid(&local_1a0);
    }
    TypeDef::get_enum_definition(&local_1d8,local_160);
    local_1c0 = &local_1d8;
    local_218 = (_Variadic_union<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
                 )read_enum((value_type *)(ulong)local_1d8.m_underlying_type,(ElementType)type,
                            data_00);
    local_208.value.
    super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
    .
    super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
    .
    super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
    .
    super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
    .
    super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
    .
    super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
    ._M_u = local_218;
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
    ::variant<winmd::reader::ElemSig::EnumValue,void,void,winmd::reader::ElemSig::EnumValue,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                *)__return_storage_ptr__,&local_208);
  }
  else {
    join_0x00000010_0x00000000_ =
         read<std::basic_string_view<char,std::char_traits<char>>>((byte_view *)type);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
    ::variant<winmd::reader::ElemSig::SystemType,void,void,winmd::reader::ElemSig::SystemType,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                *)__return_storage_ptr__,(SystemType *)&resolve_type.type_index);
  }
  return __return_storage_ptr__;
}

Assistant:

static value_type read_element(database const& db, ParamSig const& param, byte_view& data)
        {
            auto const& type = param.Type().Type();
            if (auto element_type = std::get_if<ElementType>(&type))
            {
                return read_primitive(*element_type, data);
            }
            else if (auto type_index = std::get_if<coded_index<TypeDefOrRef>>(&type))
            {
                if ((type_index->type() == TypeDefOrRef::TypeRef && type_index->TypeRef().TypeNamespace() == "System" && type_index->TypeRef().TypeName() == "Type") ||
                    (type_index->type() == TypeDefOrRef::TypeDef && type_index->TypeDef().TypeNamespace() == "System" && type_index->TypeDef().TypeName() == "Type"))
                {
                    return SystemType{ read<std::string_view>(data) };
                }
                else
                {
                    // Should be an enum. Resolve it.
                    auto resolve_type = [&db, &type_index]() -> TypeDef
                    {
                        if (type_index->type() == TypeDefOrRef::TypeDef)
                        {
                            return type_index->TypeDef();
                        }
                        auto const& typeref = type_index->TypeRef();
                        return db.get_cache().find_required(typeref.TypeNamespace(), typeref.TypeName());
                    };
                    TypeDef const& enum_type = resolve_type();
                    if (!enum_type.is_enum())
                    {
                        impl::throw_invalid("CustomAttribute params that are TypeDefOrRef must be an enum or System.Type");
                    }

                    auto const& enum_def = enum_type.get_enum_definition();
                    return EnumValue{ enum_def, read_enum(enum_def.m_underlying_type, data) };
                }
            }
            impl::throw_invalid("Custom attribute params must be primitives, enums, or System.Type");
        }